

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O1

void __thiscall
iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
Collector(Collector<iutest::detail::NoTestPartResultReporter> *this)

{
  Variable *pVVar1;
  
  (this->super_NoTestPartResultReporter).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface = (_func_int **)&PTR__Collector_00138760;
  (this->m_holder)._vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_00138788;
  (this->m_holder).m_origin = (TestPartResultReporterInterface *)0x0;
  (this->m_results).
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_results).
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_results).
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = TestEnv::get_vars();
  (this->m_holder).m_origin = pVVar1->m_testpartresult_reporter;
  pVVar1 = TestEnv::get_vars();
  pVVar1->m_testpartresult_reporter = (TestPartResultReporterInterface *)this;
  return;
}

Assistant:

Collector()
        {
            m_holder.Attach(this);
        }